

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

void crnlib::DitherBlock(color_quad_u8 *dest,color_quad_u8 *block)

{
  int local_6c;
  byte *pbStack_68;
  int y;
  uint8 *dp;
  uint8 *bp;
  int ch;
  uint8 *quant;
  int *ep2;
  int *ep1;
  int err [8];
  color_quad_u8 *block_local;
  color_quad_u8 *dest_local;
  
  ep2 = (int *)&ep1;
  quant = (uint8 *)(err + 2);
  err._24_8_ = block;
  for (bp._4_4_ = 0; bp._4_4_ < 3; bp._4_4_ = bp._4_4_ + 1) {
    dp = (uint8 *)(err._24_8_ + (long)bp._4_4_);
    pbStack_68 = (dest->field_0).c + bp._4_4_;
    memset(&ep1,0,0x20);
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      *pbStack_68 = ryg_dxt::QuantRBTab
                    [(long)(int)((uint)*dp + (*(int *)(quant + 4) * 3 + *(int *)quant * 5 >> 4)) + 8
                    ];
      *ep2 = (uint)*dp - (uint)*pbStack_68;
      pbStack_68[4] =
           ryg_dxt::QuantRBTab
           [(long)(int)((uint)dp[4] +
                       (*ep2 * 7 + *(int *)(quant + 8) * 3 + *(int *)(quant + 4) * 5 + *(int *)quant
                       >> 4)) + 8];
      ep2[1] = (uint)dp[4] - (uint)pbStack_68[4];
      pbStack_68[8] =
           ryg_dxt::QuantRBTab
           [(long)(int)((uint)dp[8] +
                       (ep2[1] * 7 + *(int *)(quant + 0xc) * 3 + *(int *)(quant + 8) * 5 +
                        *(int *)(quant + 4) >> 4)) + 8];
      ep2[2] = (uint)dp[8] - (uint)pbStack_68[8];
      pbStack_68[0xc] =
           ryg_dxt::QuantRBTab
           [(long)(int)((uint)dp[0xc] +
                       (ep2[2] * 7 + *(int *)(quant + 0xc) * 5 + *(int *)(quant + 8) >> 4)) + 8];
      ep2[3] = (uint)dp[0xc] - (uint)pbStack_68[0xc];
      std::swap<int*>(&ep2,(int **)&quant);
      dp = dp + 0x10;
      pbStack_68 = pbStack_68 + 0x10;
    }
  }
  return;
}

Assistant:

static void DitherBlock(color_quad_u8* dest, const color_quad_u8* block)
    {
        int err[8], *ep1 = err, *ep2 = err + 4;
        uint8* quant = ryg_dxt::QuantRBTab + 8;

        // process channels seperately
        for (int ch = 0; ch < 3; ch++)
        {
            uint8* bp = (uint8*)block;
            uint8* dp = (uint8*)dest;

            bp += ch;
            dp += ch;
            memset(err, 0, sizeof(err));

            for (int y = 0; y < 4; y++)
            {
                // pixel 0
                dp[0] = quant[bp[0] + ((3 * ep2[1] + 5 * ep2[0]) >> 4)];
                ep1[0] = bp[0] - dp[0];

                // pixel 1
                dp[4] = quant[bp[4] + ((7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]) >> 4)];
                ep1[1] = bp[4] - dp[4];

                // pixel 2
                dp[8] = quant[bp[8] + ((7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]) >> 4)];
                ep1[2] = bp[8] - dp[8];

                // pixel 3
                dp[12] = quant[bp[12] + ((7 * ep1[2] + 5 * ep2[3] + ep2[2]) >> 4)];
                ep1[3] = bp[12] - dp[12];

                // advance to next line
                std::swap(ep1, ep2);
                bp += 16;
                dp += 16;
            }
        }
    }